

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  long lVar5;
  long lVar6;
  ImDrawIdx IVar7;
  undefined4 in_EAX;
  ulong uVar8;
  ImDrawIdx *pIVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int i1;
  long lVar13;
  ImDrawIdx IVar14;
  uint uVar15;
  ImDrawIdx IVar16;
  bool bVar17;
  float fVar18;
  float fVar21;
  ImVec2 IVar19;
  ImVec2 IVar20;
  float fVar22;
  float fVar23;
  float afStack_38 [2];
  
  if (2 < points_count) {
    IVar3 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 2) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      for (uVar8 = 0; (uint)points_count != uVar8; uVar8 = uVar8 + 1) {
        this->_VtxWritePtr->pos = points[uVar8];
        this->_VtxWritePtr->uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = col;
        this->_VtxWritePtr = pIVar4 + 1;
      }
      uVar15 = this->_VtxCurrentIdx;
      pIVar9 = this->_IdxWritePtr;
      iVar10 = points_count + -2;
      iVar11 = uVar15 + 2;
      while (bVar17 = iVar10 != 0, iVar10 = iVar10 + -1, bVar17) {
        *pIVar9 = (ImDrawIdx)uVar15;
        pIVar9[1] = (ImDrawIdx)iVar11 - 1;
        pIVar9[2] = (ImDrawIdx)iVar11;
        pIVar9 = pIVar9 + 3;
        this->_IdxWritePtr = pIVar9;
        iVar11 = iVar11 + 1;
      }
      this->_VtxCurrentIdx = uVar15 + (points_count & 0xffffU);
    }
    else {
      afStack_38[1] = (float)(points_count * 2);
      afStack_38[0] = (float)in_EAX;
      PrimReserve(this,points_count * 9 + -6,points_count * 2);
      uVar15 = this->_VtxCurrentIdx;
      pIVar9 = this->_IdxWritePtr;
      iVar11 = points_count + -2;
      iVar10 = uVar15 + 2;
      while( true ) {
        bVar17 = iVar11 == 0;
        iVar11 = iVar11 + -1;
        IVar7 = (ImDrawIdx)uVar15;
        if (bVar17) break;
        *pIVar9 = IVar7;
        pIVar9[1] = (ImDrawIdx)iVar10;
        iVar10 = iVar10 + 2;
        pIVar9[2] = (ImDrawIdx)iVar10;
        pIVar9 = pIVar9 + 3;
        this->_IdxWritePtr = pIVar9;
      }
      uVar8 = (ulong)(uint)points_count;
      lVar5 = -(uVar8 * 8 + 0xf & 0xfffffffffffffff0);
      lVar6 = lVar5 + -0x38;
      iVar10 = points_count + -1;
      iVar11 = iVar10;
      for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
        lVar13 = (long)iVar11;
        fVar18 = points[uVar12].x - points[lVar13].x;
        fVar21 = points[uVar12].y - points[lVar13].y;
        fVar22 = fVar18 * fVar18 + fVar21 * fVar21;
        if (0.0 < fVar22) {
          fVar22 = 1.0 / SQRT(fVar22);
          fVar18 = fVar18 * fVar22;
          fVar21 = fVar21 * fVar22;
        }
        *(float *)((long)afStack_38 + lVar13 * 8 + lVar6 + 0x38) = fVar21;
        *(float *)((long)afStack_38 + lVar13 * 8 + lVar5 + 4) = -fVar18;
        iVar11 = (int)uVar12;
      }
      for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
        pIVar4 = this->_VtxWritePtr;
        uVar1 = *(undefined8 *)((long)afStack_38 + (long)iVar10 * 8 + lVar6 + 0x38);
        uVar2 = *(undefined8 *)((long)afStack_38 + uVar12 * 8 + lVar6 + 0x38);
        fVar21 = ((float)uVar2 + (float)uVar1) * 0.5;
        fVar22 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
        fVar23 = fVar21 * fVar21 + fVar22 * fVar22;
        fVar18 = 0.5;
        if (0.5 <= fVar23) {
          fVar18 = fVar23;
        }
        fVar21 = (1.0 / fVar18) * fVar21 * 0.5;
        fVar18 = (1.0 / fVar18) * fVar22 * 0.5;
        IVar19.x = points[uVar12].x - fVar21;
        IVar19.y = points[uVar12].y - fVar18;
        pIVar4->pos = IVar19;
        pIVar4->uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = col;
        IVar20.x = points[uVar12].x + fVar21;
        IVar20.y = points[uVar12].y + fVar18;
        pIVar4[1].pos = IVar20;
        pIVar4[1].uv = IVar3;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[1].col = col & 0xffffff;
        this->_VtxWritePtr = pIVar4 + 2;
        pIVar9 = this->_IdxWritePtr;
        IVar14 = (ImDrawIdx)uVar15;
        *pIVar9 = IVar14;
        pIVar9[1] = IVar7 + (short)iVar10 * 2;
        IVar16 = IVar7 + 1 + (short)iVar10 * 2;
        pIVar9[2] = IVar16;
        pIVar9[3] = IVar16;
        pIVar9[4] = IVar14 + 1;
        pIVar9[5] = IVar14;
        this->_IdxWritePtr = pIVar9 + 6;
        iVar10 = (int)uVar12;
        uVar15 = uVar15 + 2;
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + ((uint)afStack_38[1] & 0xfffe);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}